

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputInfo.cpp
# Opt level: O3

bool __thiscall
helics::InputInfo::addData
          (InputInfo *this,GlobalHandle source_id,Time valueTime,uint iteration,
          shared_ptr<const_helics::SmallBuffer> *data)

{
  pointer pGVar1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar3;
  SmallBuffer *sb1;
  pointer pvVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  dataRecord *pdVar10;
  const_iterator __position;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  uint local_4c;
  TimeRepresentation<count_time<9,_long>_> local_48;
  value_type local_40;
  
  local_40.data.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (data->super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (local_40.data.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      == (SmallBuffer *)0x0) {
    return false;
  }
  pGVar1 = (this->input_sources).
           super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = (uint)((ulong)((long)(this->input_sources).
                               super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pGVar1) >> 3);
  if ((int)uVar5 < 1) {
    return false;
  }
  lVar6 = 0;
  lVar9 = 0;
  while ((*(int *)((long)&(pGVar1->fed_id).gid + lVar6) != source_id.fed_id.gid.gid ||
         (*(int *)((long)&(pGVar1->handle).hid + lVar6) != source_id.handle.hid.hid))) {
    lVar9 = lVar9 + 0x18;
    lVar6 = lVar6 + 8;
    if ((ulong)(uVar5 & 0x7fffffff) * 0x18 == lVar9) {
      return false;
    }
  }
  if (*(long *)((long)&((this->deactivated).
                        super__Vector_base<TimeRepresentation<count_time<9,_long>_>,_std::allocator<TimeRepresentation<count_time<9,_long>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->internalTimeCode + lVar6) <
      valueTime.internalTimeCode) {
    return false;
  }
  pvVar4 = (this->data_queues).
           super__Vector_base<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar2 = *(long *)((long)&(pvVar4->
                           super__Vector_base<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                           )._M_impl.super__Vector_impl_data + lVar9 + 8);
  local_4c = iteration;
  local_48.internalTimeCode = valueTime.internalTimeCode;
  if (*(long *)((long)&(pvVar4->
                       super__Vector_base<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                       )._M_impl.super__Vector_impl_data + lVar9) == lVar2) {
    sb1 = *(SmallBuffer **)
           ((long)&(((this->current_data).
                     super__Vector_base<std::shared_ptr<const_helics::SmallBuffer>,_std::allocator<std::shared_ptr<const_helics::SmallBuffer>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
           + lVar6 * 2);
    if (sb1 == (SmallBuffer *)0x0) goto LAB_002cc93f;
    lVar2 = (this->minTimeGap).internalTimeCode;
    if ((0 < lVar2) &&
       (valueTime.internalTimeCode -
        *(long *)((long)&(((this->current_data_time).
                           super__Vector_base<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->first).internalTimeCode +
                 lVar6 * 2) < lVar2)) {
      return false;
    }
    if (this->only_update_on_change != true) goto LAB_002cc93f;
  }
  else {
    if (valueTime.internalTimeCode <= *(long *)(lVar2 + -0x20)) {
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                (data->super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      (data->super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           (element_type *)0x0;
      (data->super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      __position._M_current =
           *(dataRecord **)
            ((long)&(pvVar4->
                    super__Vector_base<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                    )._M_impl.super__Vector_impl_data + lVar9);
      uVar8 = *(long *)((long)&(pvVar4->
                               super__Vector_base<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                               )._M_impl.super__Vector_impl_data + lVar9 + 8) -
              (long)__position._M_current >> 5;
      pdVar10 = __position._M_current;
      local_40.time.internalTimeCode = valueTime.internalTimeCode;
      local_40.iteration = iteration;
      local_40.data.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00;
      if (0 < (long)uVar8) {
        do {
          uVar7 = uVar8 >> 1;
          lVar6 = pdVar10[uVar7].time.internalTimeCode;
          if ((lVar6 <= valueTime.internalTimeCode) &&
             ((lVar6 != valueTime.internalTimeCode || (pdVar10[uVar7].iteration <= iteration)))) {
            pdVar10 = pdVar10 + uVar7 + 1;
            uVar7 = ~uVar7 + uVar8;
          }
          uVar8 = uVar7;
        } while (0 < (long)uVar7);
        if (pdVar10 != __position._M_current) {
          lVar6 = (this->minTimeGap).internalTimeCode;
          if ((0 < lVar6) &&
             (valueTime.internalTimeCode - pdVar10[-1].time.internalTimeCode < lVar6)) {
LAB_002cc9ed:
            if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              return false;
            }
            CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
            return false;
          }
          __position._M_current = pdVar10;
          if (this->only_update_on_change == true) {
            bVar3 = operator==(pdVar10[-1].data.
                               super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr,local_40.data.
                                       super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr);
            if (bVar3) goto LAB_002cc9ed;
            pvVar4 = (this->data_queues).
                     super__Vector_base<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          }
        }
      }
      std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>::
      _M_insert_rval((vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                      *)((long)&(pvVar4->
                                super__Vector_base<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                                )._M_impl.super__Vector_impl_data + lVar9),__position,&local_40);
      if (local_40.data.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_40.data.
                   super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      return true;
    }
    lVar6 = (this->minTimeGap).internalTimeCode;
    if ((0 < lVar6) && (valueTime.internalTimeCode - *(long *)(lVar2 + -0x20) < lVar6)) {
      return false;
    }
    if (this->only_update_on_change != true) goto LAB_002cc93f;
    sb1 = *(SmallBuffer **)(lVar2 + -0x10);
  }
  bVar3 = operator==(sb1,local_40.data.
                         super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
  if (bVar3) {
    return false;
  }
  pvVar4 = (this->data_queues).
           super__Vector_base<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
LAB_002cc93f:
  std::vector<helics::InputInfo::dataRecord,std::allocator<helics::InputInfo::dataRecord>>::
  emplace_back<TimeRepresentation<count_time<9,long>>&,unsigned_int&,std::shared_ptr<helics::SmallBuffer_const>>
            ((vector<helics::InputInfo::dataRecord,std::allocator<helics::InputInfo::dataRecord>> *)
             ((long)&(pvVar4->
                     super__Vector_base<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                     )._M_impl.super__Vector_impl_data + lVar9),&local_48,&local_4c,data);
  return true;
}

Assistant:

bool InputInfo::addData(GlobalHandle source_id,
                        Time valueTime,
                        unsigned int iteration,
                        std::shared_ptr<const SmallBuffer> data)
{
    if (!data) {
        return false;
    }
    int index;
    bool found = false;
    for (index = 0; index < static_cast<int>(input_sources.size()); ++index) {
        if (input_sources[index] == source_id) {
            if (valueTime > deactivated[index]) {
                return false;
            }
            found = true;
            break;
        }
    }
    if (!found) {
        return false;
    }
    if (data_queues[index].empty()) {
        if (current_data[index]) {
            if (minTimeGap > timeZero) {
                if ((valueTime - current_data_time[index].first) < minTimeGap) {
                    return false;
                }
            }
            if (only_update_on_change) {
                if (*current_data[index] == *data) {
                    return false;
                }
            }
        }
        data_queues[index].emplace_back(valueTime, iteration, std::move(data));
    } else if (valueTime > data_queues[index].back().time) {
        if (minTimeGap > timeZero) {
            if ((valueTime - data_queues[index].back().time) < minTimeGap) {
                return false;
            }
        }
        if (only_update_on_change) {
            if (*data_queues[index].back().data == *data) {
                return false;
            }
        }
        data_queues[index].emplace_back(valueTime, iteration, std::move(data));
    } else {
        dataRecord newRecord(valueTime, iteration, std::move(data));
        auto m = std::upper_bound(data_queues[index].begin(),
                                  data_queues[index].end(),
                                  newRecord,
                                  recordComparison);
        if (m != data_queues[index].begin()) {
            auto prev = m;
            --prev;
            if (minTimeGap > timeZero) {
                if ((valueTime - prev->time) < minTimeGap) {
                    return false;
                }
            }
            if (only_update_on_change) {
                if (*prev->data == *newRecord.data) {
                    return false;
                }
            }
        }
        data_queues[index].insert(m, std::move(newRecord));
    }
    return true;
}